

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O0

bool __thiscall
QUdpSocketPrivate::doEnsureInitialized
          (QUdpSocketPrivate *this,QHostAddress *bindAddress,quint16 bindPort,
          QHostAddress *remoteAddress)

{
  long lVar1;
  bool bVar2;
  NetworkLayerProtocol NVar3;
  ulong uVar4;
  QHostAddress *in_RCX;
  undefined2 in_DX;
  long in_RDI;
  long in_FS_OFFSET;
  NetworkLayerProtocol proto;
  QHostAddress *address;
  NetworkLayerProtocol protocol;
  undefined6 in_stack_ffffffffffffffc0;
  quint16 in_stack_ffffffffffffffde;
  QString *in_stack_ffffffffffffffe0;
  QAbstractSocketPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  NVar3 = QHostAddress::protocol((QHostAddress *)0x26649b);
  if (NVar3 == UnknownNetworkLayerProtocol) {
    QHostAddress::protocol((QHostAddress *)0x2664ba);
  }
  if ((*(long *)(in_RDI + 0x208) == 0) ||
     (uVar4 = (**(code **)(**(long **)(in_RDI + 0x208) + 0x78))(), (uVar4 & 1) == 0)) {
    QHostAddress::toString(in_RCX);
    protocol = (NetworkLayerProtocol)((ulong)in_RCX >> 0x20);
    QAbstractSocketPrivate::resolveProxy
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde);
    QString::~QString((QString *)0x266510);
    QHostAddress::protocol((QHostAddress *)0x26651a);
    bVar2 = QAbstractSocketPrivate::initSocketLayer
                      ((QAbstractSocketPrivate *)CONCAT26(in_DX,in_stack_ffffffffffffffc0),protocol)
    ;
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00266538;
    }
  }
  bVar2 = true;
LAB_00266538:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QUdpSocketPrivate::doEnsureInitialized(const QHostAddress &bindAddress, quint16 bindPort,
                                            const QHostAddress &remoteAddress)
{
    const QHostAddress *address = &bindAddress;
    QAbstractSocket::NetworkLayerProtocol proto = address->protocol();
    if (proto == QUdpSocket::UnknownNetworkLayerProtocol) {
        address = &remoteAddress;
        proto = address->protocol();
    }

    // now check if the socket engine is initialized and to the right type
    if (!socketEngine || !socketEngine->isValid()) {
        resolveProxy(remoteAddress.toString(), bindPort);
        if (!initSocketLayer(address->protocol()))
            return false;
    }

    return true;
}